

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

uint mg_init_library(uint features)

{
  char *__src;
  bool bVar1;
  size_t sVar2;
  int iVar3;
  size_t sVar4;
  char *__dest;
  mg_http_method_info *pmVar5;
  size_t sVar6;
  long lVar7;
  
  if ((mg_init_library_called < 1) &&
     (iVar3 = pthread_mutex_init((pthread_mutex_t *)&global_lock_mutex,(pthread_mutexattr_t *)0x0),
     iVar3 != 0)) {
    return 0;
  }
  mg_global_lock();
  if (0 < mg_init_library_called) {
LAB_0011704a:
    iVar3 = mg_init_library_called + 1;
    bVar1 = 0 < mg_init_library_called;
    mg_init_library_called = 1;
    if (bVar1) {
      mg_init_library_called = iVar3;
    }
    mg_global_unlock();
    return features & 8;
  }
  iVar3 = pthread_key_create(&sTlsKey,tls_dtor);
  if (iVar3 == 0) {
    iVar3 = pthread_mutexattr_init((pthread_mutexattr_t *)&pthread_mutex_attr);
    if (iVar3 == 0) {
      iVar3 = pthread_mutexattr_settype((pthread_mutexattr_t *)&pthread_mutex_attr,1);
      if (iVar3 == 0) {
        sVar6 = 1;
        pmVar5 = http_methods;
        for (lVar7 = 0; lVar7 != 0x200; lVar7 = lVar7 + 0x20) {
          sVar4 = strlen(*(char **)((long)&http_methods[0].name + lVar7));
          sVar2 = sVar4 + 2;
          if (lVar7 == 0) {
            sVar2 = sVar4;
          }
          sVar6 = sVar2 + sVar6;
        }
        __dest = (char *)malloc(sVar6);
        all_methods = __dest;
        if (__dest != (char *)0x0) {
          *__dest = '\0';
          lVar7 = 0;
          do {
            __src = pmVar5->name;
            if (lVar7 == 0) {
              strcpy(__dest,__src);
            }
            else {
              if (lVar7 == 0x10) goto LAB_0011704a;
              sVar6 = strlen(__dest);
              (__dest + sVar6)[0] = ',';
              (__dest + sVar6)[1] = ' ';
              __dest[sVar6 + 2] = '\0';
              strcat(__dest,__src);
            }
            lVar7 = lVar7 + 1;
            pmVar5 = pmVar5 + 1;
          } while( true );
        }
        goto LAB_001170d0;
      }
      pthread_mutexattr_destroy((pthread_mutexattr_t *)&pthread_mutex_attr);
    }
    pthread_key_delete(sTlsKey);
  }
LAB_001170d0:
  mg_global_unlock();
  pthread_mutex_destroy((pthread_mutex_t *)&global_lock_mutex);
  return 0;
}

Assistant:

CIVETWEB_API unsigned
mg_init_library(unsigned features)
{
	unsigned features_to_init = mg_check_feature(features & 0xFFu);
	unsigned features_inited = features_to_init;

	if (mg_init_library_called <= 0) {
		/* Not initialized yet */
		if (0 != pthread_mutex_init(&global_lock_mutex, NULL)) {
			return 0;
		}
	}

	mg_global_lock();

	if (mg_init_library_called <= 0) {
		int i;
		size_t len;

#if defined(_WIN32)
		int file_mutex_init = 1;
		int wsa = 1;
#else
		int mutexattr_init = 1;
#endif
		int failed = 1;
		int key_create = pthread_key_create(&sTlsKey, tls_dtor);

		if (key_create == 0) {
#if defined(_WIN32)
			file_mutex_init =
			    pthread_mutex_init(&global_log_file_lock, &pthread_mutex_attr);
			if (file_mutex_init == 0) {
				/* Start WinSock */
				WSADATA data;
				failed = wsa = WSAStartup(MAKEWORD(2, 2), &data);
			}
#else
			mutexattr_init = pthread_mutexattr_init(&pthread_mutex_attr);
			if (mutexattr_init == 0) {
				failed = pthread_mutexattr_settype(&pthread_mutex_attr,
				                                   PTHREAD_MUTEX_RECURSIVE);
			}
#endif
		}

		if (failed) {
#if defined(_WIN32)
			if (wsa == 0) {
				(void)WSACleanup();
			}
			if (file_mutex_init == 0) {
				(void)pthread_mutex_destroy(&global_log_file_lock);
			}
#else
			if (mutexattr_init == 0) {
				(void)pthread_mutexattr_destroy(&pthread_mutex_attr);
			}
#endif
			if (key_create == 0) {
				(void)pthread_key_delete(sTlsKey);
			}
			mg_global_unlock();
			(void)pthread_mutex_destroy(&global_lock_mutex);
			return 0;
		}

		len = 1;
		for (i = 0; http_methods[i].name != NULL; i++) {
			size_t sl = strlen(http_methods[i].name);
			len += sl;
			if (i > 0) {
				len += 2;
			}
		}
		all_methods = (char *)mg_malloc(len);
		if (!all_methods) {
			/* Must never happen */
			mg_global_unlock();
			(void)pthread_mutex_destroy(&global_lock_mutex);
			return 0;
		}
		all_methods[0] = 0;
		for (i = 0; http_methods[i].name != NULL; i++) {
			if (i > 0) {
				strcat(all_methods, ", ");
				strcat(all_methods, http_methods[i].name);
			} else {
				strcpy(all_methods, http_methods[i].name);
			}
		}
	}

#if defined(USE_LUA)
	lua_init_optional_libraries();
#endif

#if (defined(OPENSSL_API_1_0) || defined(OPENSSL_API_1_1)                      \
     || defined(OPENSSL_API_3_0))                                              \
    && !defined(NO_SSL)

	if (features_to_init & MG_FEATURES_SSL) {
		if (!mg_openssl_initialized) {
			char ebuf[128];
			if (initialize_openssl(ebuf, sizeof(ebuf))) {
				mg_openssl_initialized = 1;
			} else {
				(void)ebuf;
				DEBUG_TRACE("Initializing SSL failed: %s", ebuf);
				features_inited &= ~((unsigned)(MG_FEATURES_SSL));
			}
		} else {
			/* ssl already initialized */
		}
	}

#endif

	if (mg_init_library_called <= 0) {
		mg_init_library_called = 1;
	} else {
		mg_init_library_called++;
	}
	mg_global_unlock();

	return features_inited;
}